

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::vector_writer_policy>::
put<unsigned_char>(writer_base<pstore::serialize::archive::details::vector_writer_policy> *this,
                  uchar *t)

{
  result_type rVar1;
  result_type r;
  uchar *t_local;
  writer_base<pstore::serialize::archive::details::vector_writer_policy> *this_local;
  
  if ((this->flushed_ & 1U) == 0) {
    rVar1 = details::vector_writer_policy::put<unsigned_char>(&this->policy_,t);
    this->bytes_consumed_ = this->bytes_consumed_ + 1;
    return rVar1;
  }
  assert_failed("!flushed_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0xa3);
}

Assistant:

auto put (Ty const & t) -> result_type {
                    static_assert (std::is_standard_layout<Ty>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    result_type r = policy_.put (t);
                    bytes_consumed_ += sizeof (t);
                    return r;
                }